

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info_hash.hpp
# Opt level: O1

void __thiscall
libtorrent::info_hash_t::for_each<libtorrent::aux::torrent::lsd_announce()::__0>
          (info_hash_t *this,anon_class_16_2_3fe4823c f)

{
  session_interface *psVar1;
  bool bVar2;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  uint local_28;
  
  bVar2 = digest32<160L>::is_all_zeros(&this->v1);
  if (!bVar2) {
    psVar1 = ((f.this)->super_torrent_hot_members).m_ses;
    (*(psVar1->super_session_logger)._vptr_session_logger[0x3e])(psVar1,this,(ulong)(uint)*f.port);
  }
  bVar2 = digest32<256L>::is_all_zeros(&this->v2);
  if (!bVar2) {
    local_28 = (this->v2).m_number._M_elems[4];
    local_38 = (this->v2).m_number._M_elems[0];
    uStack_34 = (this->v2).m_number._M_elems[1];
    uStack_30 = (this->v2).m_number._M_elems[2];
    uStack_2c = (this->v2).m_number._M_elems[3];
    psVar1 = ((f.this)->super_torrent_hot_members).m_ses;
    (*(psVar1->super_session_logger)._vptr_session_logger[0x3e])
              (psVar1,&local_38,(ulong)(uint)*f.port);
  }
  return;
}

Assistant:

void for_each(F f) const
		{
			if (has_v1()) f(v1, protocol_version::V1);
			if (has_v2()) f(sha1_hash(v2.data()), protocol_version::V2);
		}